

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_intersect.h
# Opt level: O3

result crnlib::intersection::
       ray_aabb<crnlib::vec<3u,float>,float,crnlib::ray<crnlib::vec<3u,float>>,crnlib::vec_interval<crnlib::vec<3u,float>>>
                 (vec<3U,_float> *coord,float *t,ray<crnlib::vec<3U,_float>_> *ray,
                 vec_interval<crnlib::vec<3U,_float>_> *box)

{
  float *pfVar1;
  uint uVar2;
  int i;
  result rVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float max_t [3];
  float candidate_plane [3];
  int quadrant [3];
  
  bVar5 = true;
  lVar4 = 0;
  do {
    fVar10 = (ray->m_origin).m_s[lVar4];
    fVar9 = box->m_bounds[0].m_s[lVar4];
    if (fVar9 <= fVar10) {
      fVar9 = box->m_bounds[1].m_s[lVar4];
      if (fVar9 < fVar10) {
        quadrant[lVar4] = 0;
        goto LAB_00173271;
      }
      quadrant[lVar4] = 2;
    }
    else {
      quadrant[lVar4] = 1;
LAB_00173271:
      candidate_plane[lVar4] = fVar9;
      bVar5 = false;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 3) {
      if (bVar5) {
        if ((ray<crnlib::vec<3U,_float>_> *)coord != ray) {
          lVar4 = 0;
          do {
            coord->m_s[lVar4] = (ray->m_origin).m_s[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
        }
        *t = 0.0;
        return cInside;
      }
      lVar4 = 0;
      do {
        fVar10 = -1.0;
        if (quadrant[lVar4] != 2) {
          fVar9 = (ray->m_direction).m_s[lVar4];
          fVar10 = -1.0;
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            fVar10 = (candidate_plane[lVar4] - (ray->m_origin).m_s[lVar4]) / fVar9;
          }
        }
        max_t[lVar4] = fVar10;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar7 = 0;
      lVar4 = 1;
      do {
        uVar2 = (uint)lVar4;
        if (max_t[lVar4] < max_t[(int)uVar7] || max_t[lVar4] == max_t[(int)uVar7]) {
          uVar2 = uVar7;
        }
        uVar7 = uVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      fVar10 = max_t[(int)uVar7];
      rVar3 = cFailure;
      if (0.0 <= fVar10) {
        uVar6 = (ulong)uVar7;
        uVar8 = 0;
        do {
          if (uVar6 == uVar8) {
            coord->m_s[uVar6] = candidate_plane[uVar6];
          }
          else {
            fVar9 = (ray->m_direction).m_s[uVar8] * fVar10 + (ray->m_origin).m_s[uVar8];
            coord->m_s[uVar8] = fVar9;
            if (fVar9 < box->m_bounds[0].m_s[uVar8]) {
              return cFailure;
            }
            pfVar1 = box->m_bounds[1].m_s + uVar8;
            if (*pfVar1 <= fVar9 && fVar9 != *pfVar1) {
              return cFailure;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
        *t = fVar10;
        rVar3 = cSuccess;
      }
      return rVar3;
    }
  } while( true );
}

Assistant:

result ray_aabb(vector_type& coord, scalar_type& t, const ray_type& ray, const aabb_type& box)
        {
            enum
            {
                cNumDim = vector_type::num_elements,
                cRight = 0,
                cLeft = 1,
                cMiddle = 2
            };

            bool inside = true;
            int quadrant[cNumDim];
            scalar_type candidate_plane[cNumDim];

            for (int i = 0; i < cNumDim; i++)
            {
                if (ray.get_origin()[i] < box[0][i])
                {
                    quadrant[i] = cLeft;
                    candidate_plane[i] = box[0][i];
                    inside = false;
                }
                else if (ray.get_origin()[i] > box[1][i])
                {
                    quadrant[i] = cRight;
                    candidate_plane[i] = box[1][i];
                    inside = false;
                }
                else
                {
                    quadrant[i] = cMiddle;
                }
            }

            if (inside)
            {
                coord = ray.get_origin();
                t = 0.0f;
                return cInside;
            }

            scalar_type max_t[cNumDim];
            for (int i = 0; i < cNumDim; i++)
            {
                if ((quadrant[i] != cMiddle) && (ray.get_direction()[i] != 0.0f))
                {
                    max_t[i] = (candidate_plane[i] - ray.get_origin()[i]) / ray.get_direction()[i];
                }
                else
                {
                    max_t[i] = -1.0f;
                }
            }

            int which_plane = 0;
            for (int i = 1; i < cNumDim; i++)
            {
                if (max_t[which_plane] < max_t[i])
                {
                    which_plane = i;
                }
            }
            if (max_t[which_plane] < 0.0f)
            {
                return cFailure;
            }

            for (int i = 0; i < cNumDim; i++)
            {
                if (i != which_plane)
                {
                    coord[i] = ray.get_origin()[i] + max_t[which_plane] * ray.get_direction()[i];

                    if ((coord[i] < box[0][i]) || (coord[i] > box[1][i]))
                    {
                        return cFailure;
                    }
                }
                else
                {
                    coord[i] = candidate_plane[i];
                }

                CRNLIB_ASSERT(coord[i] >= box[0][i] && coord[i] <= box[1][i]);
            }

            t = max_t[which_plane];
            return cSuccess;
        }